

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::compareGenMipmapBilinear
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int i;
  long lVar4;
  int iVar5;
  int iVar6;
  Vec4 result;
  undefined4 local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  undefined1 *local_d0;
  ConstPixelBufferAccess *local_c8;
  PixelBufferAccess *local_c0;
  undefined1 local_b8 [16];
  LookupPrecision local_a8;
  Vec4 local_7c;
  Sampler local_6c;
  
  local_d0 = (undefined1 *)&local_e8;
  iVar3 = (dst->m_size).m_data[0];
  iVar6 = (dst->m_size).m_data[1];
  iVar5 = (src->m_size).m_data[0];
  iVar1 = (src->m_size).m_data[1];
  local_6c.wrapS = CLAMP_TO_EDGE;
  local_6c.wrapT = CLAMP_TO_EDGE;
  local_6c.wrapR = CLAMP_TO_EDGE;
  local_6c.minFilter = LINEAR;
  local_6c.magFilter = LINEAR;
  local_6c.lodThreshold = 0.0;
  local_6c.normalizedCoords = false;
  local_6c.depthStencilMode = MODE_DEPTH;
  local_6c.compare = COMPAREMODE_NONE;
  local_6c.compareChannel = 0;
  local_6c.borderColor.v.uData[0]._0_1_ = 0;
  local_6c.borderColor.v._1_7_ = 0;
  local_6c.borderColor.v.uData[2]._0_1_ = 0;
  local_6c._45_8_ = 0;
  lVar4 = 0;
  do {
    local_a8.coordBits.m_data[lVar4] = 0x16;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8 = (float)iVar3;
  local_dc = (float)iVar5;
  lVar4 = 3;
  do {
    local_a8.coordBits.m_data[lVar4] = 0x10;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_e0 = (float)iVar6;
  local_a8.colorThreshold.m_data._0_8_ = *(undefined8 *)(precision->colorThreshold).m_data;
  local_a8.colorThreshold.m_data._8_8_ = *(undefined8 *)((precision->colorThreshold).m_data + 2);
  local_a8.colorMask.m_data = *&(precision->colorMask).m_data;
  lVar4 = 0;
  do {
    *(undefined4 *)(local_b8 + lVar4 * 4) = 0x16;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8.coordBits.m_data[2] = local_b8._8_4_;
  local_a8.coordBits.m_data[0] = local_b8._0_4_;
  local_a8.coordBits.m_data[1] = local_b8._4_4_;
  local_a8.uvwBits.m_data[2] = (precision->filterBits).m_data[2];
  local_a8.uvwBits.m_data._0_8_ = *(undefined8 *)(precision->filterBits).m_data;
  if ((dst->m_size).m_data[1] < 1) {
    iVar3 = 0;
  }
  else {
    local_e4 = (float)iVar1;
    iVar3 = 0;
    iVar6 = 0;
    local_c8 = src;
    local_c0 = errorMask;
    do {
      if (0 < (dst->m_size).m_data[0]) {
        local_d4 = (((float)iVar6 + 0.5) / local_e0) * local_e4;
        iVar5 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_b8,(int)dst,iVar5,iVar6);
          local_7c.m_data[0] = (((float)iVar5 + 0.5) / local_d8) * local_dc;
          local_7c.m_data[1] = local_d4;
          bVar2 = tcu::isLinearSampleResultValid
                            (local_c8,&local_6c,&local_a8,(Vec2 *)&local_7c,0,(Vec4 *)local_b8);
          if (bVar2) {
            local_e8 = 0xff00ff00;
          }
          else {
            local_e8 = 0xff0000ff;
          }
          tcu::RGBA::toVec((RGBA *)&local_7c);
          tcu::PixelBufferAccess::setPixel(local_c0,&local_7c,iVar5,iVar6,0);
          iVar3 = iVar3 + (uint)!bVar2;
          iVar5 = iVar5 + 1;
        } while (iVar5 < (dst->m_size).m_data[0]);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < (dst->m_size).m_data[1]);
  }
  return iVar3;
}

Assistant:

static int compareGenMipmapBilinear (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	// Translation to lookup verification parameters.
	const tcu::Sampler		sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
										 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR, 0.0f, false /* non-normalized coords */);
	tcu::LookupPrecision	lookupPrec;

	lookupPrec.colorThreshold	= precision.colorThreshold;
	lookupPrec.colorMask		= precision.colorMask;
	lookupPrec.coordBits		= tcu::IVec3(22);
	lookupPrec.uvwBits			= precision.filterBits;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const float		cx		= (float(x)+0.5f) / dstW * srcW;
		const float		cy		= (float(y)+0.5f) / dstH * srcH;
		const bool		isOk	= tcu::isLinearSampleResultValid(src, sampler, lookupPrec, tcu::Vec2(cx, cy), 0, result);

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}